

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_24::Inhabitator::markNullable(Inhabitator *this,FieldPos field)

{
  undefined8 *puVar1;
  uintptr_t *puVar2;
  HeapType type;
  _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var3;
  uint uVar4;
  undefined8 uVar5;
  _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var6;
  int iVar7;
  long *plVar8;
  long lVar9;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar10;
  __node_gen_type *p_Var11;
  byte extraout_DL;
  byte bVar12;
  byte extraout_DL_00;
  __node_gen_type *p_Var13;
  __hashtable *__h;
  ulong uVar14;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  *puVar15;
  uintptr_t *puVar16;
  undefined1 auVar17 [16];
  _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Stack_148;
  FieldPos field_local;
  __node_gen_type __node_gen;
  __node_gen_type *p_Stack_88;
  __hashtable *__h_1;
  _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_60;
  undefined1 local_58 [8];
  __node_gen_type __node_gen_1;
  HeapType local_48;
  
  p_Stack_148 = (_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)field.first.id;
  field_local.first.id._0_4_ = field.second;
  puVar15 = &this->nullables;
  field_local._8_8_ = puVar15;
  std::
  _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::pair<wasm::HeapType,unsigned_int>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
            ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)puVar15,&p_Stack_148);
  uVar4 = (uint)field_local.first.id;
  local_48.id = (uintptr_t)p_Stack_148;
  local_58 = (undefined1  [8])p_Stack_148;
  __node_gen_1._M_h._0_4_ = (uint)field_local.first.id;
  if (((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        *)0x7c < p_Stack_148) && (iVar7 = wasm::HeapType::getKind(), iVar7 != 1)) {
    uVar14 = (ulong)(uint)__node_gen_1._M_h;
    local_60 = (_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_58;
    iVar7 = wasm::HeapType::getKind();
    if (iVar7 == 3) {
      wasm::HeapType::getArray();
    }
    else {
      if (iVar7 != 2) {
        __assert_fail("field",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x2c7,
                      "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                     );
      }
      plVar8 = (long *)wasm::HeapType::getStruct();
      puVar1 = (undefined8 *)(*plVar8 + uVar14 * 0x10);
      field_local._8_8_ = *puVar1;
      __node_gen._M_h = (__hashtable_alloc *)puVar1[1];
    }
    if (__node_gen._M_h._4_4_ == 1) {
      iVar7 = wasm::HeapType::getKind();
      if (iVar7 == 3) {
        auVar17 = wasm::HeapType::getDeclaredSuperType();
        p_Var6 = auVar17._0_8_;
        while (p_Var3 = p_Var6, (auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          auVar17 = wasm::HeapType::getDeclaredSuperType();
          p_Var6 = auVar17._0_8_;
          local_48.id = (uintptr_t)p_Var3;
        }
      }
      else {
        iVar7 = wasm::HeapType::getKind();
        if (iVar7 != 2) {
          __assert_fail("curr.isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                        ,0x2e6,
                        "void wasm::(anonymous namespace)::Inhabitator::markNullable(FieldPos)");
        }
        field_local._8_8_ = wasm::HeapType::getDeclaredSuperType();
        __node_gen._M_h._0_1_ = extraout_DL;
        bVar12 = extraout_DL;
        while (((bVar12 & 1) != 0 &&
               (plVar8 = (long *)wasm::HeapType::getStruct(), uVar5 = field_local._8_8_,
               (ulong)uVar4 < (ulong)(plVar8[1] - *plVar8 >> 4)))) {
          field_local._8_8_ = wasm::HeapType::getDeclaredSuperType();
          __node_gen._M_h._0_1_ = extraout_DL_00;
          local_48.id = uVar5;
          bVar12 = extraout_DL_00;
        }
      }
      field_local._8_8_ = local_48.id;
      __node_gen._M_h._0_4_ = uVar4;
      local_58 = (undefined1  [8])puVar15;
      std::
      _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
                ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar15,&field_local.second);
      field_local.second = 0;
      field_local._12_4_ = 0;
      p_Stack_88 = (__node_gen_type *)0x0;
      local_58 = (undefined1  [8])SubTypes::getImmediateSubTypes(&this->subtypes,local_48);
      __node_gen_1._M_h._0_4_ = 1;
      SmallVector<Item,_10UL>::push_back
                ((SmallVector<Item,_10UL> *)&field_local.second,(Item *)local_58);
      p_Var11 = (__node_gen_type *)0x0;
      if (field_local._8_8_ != 0) {
        lVar9 = field_local._8_8_;
        do {
          if (p_Var11 == (__node_gen_type *)0x0) {
            if (lVar9 == 0) {
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,"T &wasm::SmallVector<Item, 10>::back() [T = Item, N = 10]");
            }
            lVar9 = lVar9 + -1;
            p_Var13 = &__node_gen + lVar9 * 2;
            field_local._8_8_ = lVar9;
          }
          else {
            p_Var11 = p_Var11 + -2;
            p_Var13 = p_Var11;
            p_Stack_88 = p_Var11;
          }
          puVar16 = *(uintptr_t **)p_Var13->_M_h;
          puVar2 = *(uintptr_t **)(p_Var13->_M_h + 8);
          if (puVar16 != puVar2) {
            iVar7 = *(int *)&p_Var13[1]._M_h;
            do {
              type.id = *puVar16;
              __node_gen_1._M_h._0_4_ = uVar4;
              local_60 = (_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)puVar15;
              local_58 = (undefined1  [8])type.id;
              std::
              _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
                        ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)puVar15,(Item *)local_58,&local_60);
              pvVar10 = SubTypes::getImmediateSubTypes(&this->subtypes,type);
              if ((pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
                local_58 = (undefined1  [8])pvVar10;
                __node_gen_1._M_h._0_4_ = iVar7 + 1;
                SmallVector<Item,_10UL>::push_back
                          ((SmallVector<Item,_10UL> *)&field_local.second,(Item *)local_58);
              }
              puVar16 = puVar16 + 1;
              lVar9 = field_local._8_8_;
              p_Var11 = p_Stack_88;
            } while (puVar16 != puVar2);
          }
        } while (((long)p_Var11 >> 4) + lVar9 != 0);
      }
    }
    else {
      auVar17 = wasm::HeapType::getDeclaredSuperType();
      field_local._8_8_ = auVar17._0_8_;
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        do {
          __node_gen._M_h._0_4_ = uVar4;
          local_58 = (undefined1  [8])puVar15;
          std::
          _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
                    ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)puVar15,&field_local.second,local_58);
          auVar17 = wasm::HeapType::getDeclaredSuperType();
          field_local._8_8_ = auVar17._0_8_;
        } while ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
      }
    }
    return;
  }
  __assert_fail("!type.isBasic() && !type.isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                ,0x2c5,
                "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
               );
}

Assistant:

void Inhabitator::markNullable(FieldPos field) {
  // Mark the given field nullable in the original type and in other types
  // necessary to keep subtyping valid.
  nullables.insert(field);
  auto [curr, idx] = field;
  switch (getVariance(field)) {
    case Covariant:
      // Mark the field null in all supertypes. If the supertype field is
      // already nullable or does not exist, that's ok and this will have no
      // effect.
      while (auto super = curr.getDeclaredSuperType()) {
        nullables.insert({*super, idx});
        curr = *super;
      }
      break;
    case Invariant:
      // Find the top type for which this field exists and mark the field
      // nullable in all of its subtypes.
      if (curr.isArray()) {
        while (auto super = curr.getDeclaredSuperType()) {
          curr = *super;
        }
      } else {
        assert(curr.isStruct());
        while (auto super = curr.getDeclaredSuperType()) {
          if (super->getStruct().fields.size() <= idx) {
            break;
          }
          curr = *super;
        }
      }
      // Mark the field nullable in all subtypes. If the subtype field is
      // already nullable, that's ok and this will have no effect. TODO: Remove
      // this extra `index` variable once we have C++20. It's a workaround for
      // lambdas being unable to capture structured bindings.
      const size_t index = idx;
      subtypes.iterSubTypes(curr, [&](HeapType type, Index) {
        nullables.insert({type, index});
      });
      break;
  }
}